

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  double dVar2;
  undefined4 *puVar3;
  double *pdVar4;
  double *pdVar5;
  ulong *puVar6;
  undefined1 auVar7 [16];
  int iVar8;
  undefined1 (*pauVar9) [16];
  long *plVar10;
  long *plVar11;
  long *plVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  undefined4 local_10c;
  SUNContext ctx;
  void *ida_mem;
  undefined1 (*local_f8) [16];
  int indexB1;
  void *local_e8;
  long *local_e0;
  int indexB2;
  void *local_d0;
  void *local_c8;
  sunrealtype time;
  void *local_b8;
  double local_b0;
  void *local_a8;
  long *local_a0;
  undefined8 *local_98;
  void *local_90;
  long *local_88;
  long *local_80;
  long *local_78;
  undefined8 *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  double local_50;
  double local_48;
  long *local_40;
  int nckp;
  
  ctx = (SUNContext)0x0;
  SUNContext_Create(0,&ctx);
  puts("\nAdjoint Sensitivity Example for Chemical Kinetics");
  puts("---------------------------------------------------------");
  puts("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0");
  puts("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0");
  puts("               y1  +  y2  +  y3 = 0\n");
  puts("Find dG/dp and d^2G/dp^2, where p=[p1,p2] for");
  puts("     G = int_t0^tB0 g(t,p,y) dt");
  puts("     g(t,p,y) = y3\n\n");
  pauVar9 = (undefined1 (*) [16])malloc(0x18);
  *(undefined4 *)*pauVar9 = 0x47ae147b;
  *(undefined4 *)(*pauVar9 + 4) = 0x3fa47ae1;
  *(undefined4 *)(*pauVar9 + 8) = 0;
  *(undefined4 *)(*pauVar9 + 0xc) = 0x40c38800;
  *(undefined8 *)pauVar9[1] = 0x417c9c3800000000;
  plVar10 = (long *)N_VNew_Serial(3,ctx);
  plVar11 = (long *)N_VClone(plVar10);
  puVar13 = *(undefined8 **)(*plVar10 + 0x10);
  *puVar13 = 0x3ff0000000000000;
  puVar13[1] = 0;
  puVar13[2] = 0;
  puVar3 = *(undefined4 **)(*plVar11 + 0x10);
  *puVar3 = 0x47ae147b;
  puVar3[1] = 0xbfa47ae1;
  puVar3[2] = 0x47ae147b;
  puVar3[3] = 0x3fa47ae1;
  *(undefined8 *)(puVar3 + 4) = 0;
  plVar12 = (long *)N_VNew_Serial(1,ctx);
  N_VConst(0,plVar12);
  local_e0 = plVar10;
  puVar13 = (undefined8 *)N_VCloneVectorArray(2,plVar10);
  local_68 = plVar11;
  puVar14 = (undefined8 *)N_VCloneVectorArray(2,plVar11);
  N_VConst(0,*puVar13);
  local_98 = puVar13;
  N_VConst(0,puVar13[1]);
  N_VConst(0,*puVar14);
  N_VConst(0,puVar14[1]);
  puVar13 = (undefined8 *)N_VCloneVectorArray(2,plVar12);
  for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
    N_VConst(0,puVar13[lVar19]);
  }
  local_f8 = pauVar9;
  local_a0 = plVar12;
  local_70 = puVar14;
  pvVar15 = (void *)IDACreate(ctx);
  plVar11 = local_68;
  plVar10 = local_e0;
  ida_mem = pvVar15;
  IDAInit(0,pvVar15,res,local_e0,local_68);
  IDASStolerances(0xe2308c3a,0x3ddb7cdfd9d7bdbb,pvVar15);
  pvVar16 = (void *)SUNDenseMatrix(3,3,ctx);
  iVar8 = check_retval(pvVar16,"SUNDenseMatrix",0);
  iVar18 = 1;
  if (iVar8 == 0) {
    pvVar17 = (void *)SUNLinSol_Dense(plVar10,pvVar16,ctx);
    iVar8 = check_retval(pvVar17,"SUNLinSol_Dense",0);
    if (iVar8 == 0) {
      local_10c = IDASetLinearSolver(pvVar15,pvVar17,pvVar16);
      iVar18 = 1;
      iVar8 = check_retval(&local_10c,"IDASetLinearSolver",1);
      if (iVar8 == 0) {
        local_c8 = pvVar16;
        local_a8 = pvVar17;
        local_10c = IDASetUserData(pvVar15,local_f8);
        local_10c = IDASetMaxNumSteps(pvVar15,0x5dc);
        plVar10 = local_a0;
        local_10c = IDAQuadInit(pvVar15,rhsQ,local_a0);
        local_10c = IDAQuadSStolerances(0xe2308c3a,0x3ddb7cdfd9d7bdbb,pvVar15);
        iVar18 = 1;
        local_10c = IDASetQuadErrCon(pvVar15,1);
        local_10c = IDASensInit(pvVar15,2,1,resS,local_98,local_70);
        local_10c = IDASensEEtolerances(pvVar15);
        local_10c = IDASetSensErrCon(pvVar15,1);
        local_10c = IDAQuadSensInit(pvVar15,rhsQS,puVar13);
        local_10c = IDAQuadSensEEtolerances(pvVar15);
        local_10c = IDASetQuadSensErrCon(pvVar15,1);
        local_10c = IDAAdjInit(pvVar15,100,1);
        puts("---------------------------------------------------------");
        puts("Forward integration");
        puts("---------------------------------------------------------\n");
        local_10c = IDASolveF(0,pvVar15,&time,local_e0,plVar11,1,&nckp);
        IDAGetQuad(pvVar15,&time,plVar10);
        local_b0 = **(double **)(*plVar10 + 0x10);
        printf("     G:    %12.4e\n");
        puVar14 = local_98;
        IDAGetSensDky(0,pvVar15,0,local_98);
        IDAGetSensDky(0,pvVar15,1,local_70);
        IDAGetQuadSens(pvVar15,&time,puVar13);
        printf("   dG/dp:  %12.4e %12.4e\n",(int)**(undefined8 **)(*(long *)*puVar13 + 0x10),
               **(undefined8 **)(*(long *)puVar13[1] + 0x10));
        putchar(10);
        plVar11 = (long *)N_VNew_Serial(6,ctx);
        plVar12 = (long *)N_VClone(plVar11);
        N_VConst(0,plVar11);
        plVar10 = local_e0;
        lVar19 = *(long *)(*plVar11 + 0x10);
        *(undefined8 *)(lVar19 + 0x10) = *(undefined8 *)(*(long *)(*local_e0 + 0x10) + 0x10);
        *(undefined8 *)(lVar19 + 0x28) = *(undefined8 *)(*(long *)(*(long *)*puVar14 + 0x10) + 0x10)
        ;
        N_VConst(0,plVar12);
        pdVar4 = *(double **)(*plVar10 + 0x10);
        pdVar5 = *(double **)(*plVar12 + 0x10);
        *pdVar5 = pdVar4[2] - *pdVar4;
        pdVar5[1] = pdVar4[2] - pdVar4[1];
        pdVar4 = *(double **)(*(long *)*puVar14 + 0x10);
        pdVar5[3] = pdVar4[2] - *pdVar4;
        pdVar5[4] = pdVar4[2] - pdVar4[1];
        local_80 = (long *)N_VNew_Serial(4,ctx);
        N_VConst(0,local_80);
        pvVar15 = ida_mem;
        local_10c = IDACreateB(ida_mem,&indexB1);
        local_78 = plVar11;
        local_58 = plVar12;
        local_10c = IDAInitBS(0,pvVar15,indexB1,resBS1,plVar11,plVar12);
        local_10c = IDASStolerancesB(0xe2308c3a,0x3e45798ee2308c3a,pvVar15,indexB1);
        local_10c = IDASetUserDataB(pvVar15,indexB1,local_f8);
        local_10c = IDASetMaxNumStepsB(pvVar15,indexB1,5000);
        pvVar16 = (void *)SUNDenseMatrix(6,6,ctx);
        iVar8 = check_retval(pvVar16,"SUNDenseMatrix",0);
        if (iVar8 == 0) {
          local_e8 = pvVar15;
          pvVar17 = (void *)SUNLinSol_Dense(local_78,pvVar16,ctx);
          iVar8 = check_retval(pvVar17,"SUNLinSol_Dense",0);
          pvVar15 = local_e8;
          if (iVar8 == 0) {
            local_10c = IDASetLinearSolverB(local_e8,indexB1,pvVar17,pvVar16);
            iVar18 = 1;
            iVar8 = check_retval(&local_10c,"IDASetLinearSolverB",1);
            if (iVar8 == 0) {
              local_d0 = pvVar16;
              local_90 = pvVar17;
              local_10c = IDAQuadInitBS(pvVar15,indexB1,rhsQBS1,local_80);
              plVar11 = (long *)N_VNew_Serial(6,ctx);
              plVar12 = (long *)N_VNew_Serial(6,ctx);
              N_VConst(0,plVar11);
              puVar14 = local_98;
              plVar10 = local_e0;
              lVar19 = *(long *)(*plVar11 + 0x10);
              *(undefined8 *)(lVar19 + 0x10) = *(undefined8 *)(*(long *)(*local_e0 + 0x10) + 0x10);
              *(undefined8 *)(lVar19 + 0x28) =
                   *(undefined8 *)(*(long *)(*(long *)local_98[1] + 0x10) + 0x10);
              N_VConst(0,plVar12);
              pdVar4 = *(double **)(*plVar10 + 0x10);
              pdVar5 = *(double **)(*plVar12 + 0x10);
              *pdVar5 = pdVar4[2] - *pdVar4;
              pdVar5[1] = pdVar4[2] - pdVar4[1];
              pdVar4 = *(double **)(*(long *)puVar14[1] + 0x10);
              pdVar5[3] = pdVar4[2] - *pdVar4;
              pdVar5[4] = pdVar4[2] - pdVar4[1];
              local_88 = (long *)N_VNew_Serial(4,ctx);
              N_VConst(0,local_88);
              pvVar15 = local_e8;
              local_10c = IDACreateB(local_e8,&indexB2);
              local_60 = plVar11;
              local_10c = IDAInitBS(0,pvVar15,indexB2,resBS2,plVar11,plVar12);
              local_10c = IDASStolerancesB(0xe2308c3a,0x3e45798ee2308c3a,pvVar15,indexB2);
              local_10c = IDASetUserDataB(pvVar15,indexB2,local_f8);
              local_10c = IDASetMaxNumStepsB(pvVar15,indexB2,0x9c4);
              pvVar15 = (void *)SUNDenseMatrix(6,6,ctx);
              iVar8 = check_retval(pvVar15,"SUNDenseMatrix",0);
              if (iVar8 == 0) {
                local_40 = plVar12;
                local_b8 = (void *)SUNLinSol_Dense(local_60,pvVar15,ctx);
                iVar8 = check_retval(local_b8,"SUNLinSol_Dense",0);
                plVar10 = local_78;
                if (iVar8 == 0) {
                  local_10c = IDASetLinearSolverB(local_e8,indexB2,local_b8,pvVar15);
                  iVar18 = 1;
                  iVar8 = check_retval(&local_10c,"IDASetLinearSolverB",1);
                  pvVar16 = local_e8;
                  if (iVar8 == 0) {
                    local_10c = IDAQuadInitBS(local_e8,indexB2,rhsQBS2,local_88);
                    puts("---------------------------------------------------------");
                    puts("Backward integration ");
                    puts("---------------------------------------------------------\n");
                    iVar18 = 1;
                    local_10c = IDASolveB(0,pvVar16,1);
                    local_10c = IDAGetB(pvVar16,indexB1,&time,plVar10,local_58);
                    plVar11 = local_80;
                    local_10c = IDAGetQuadB(pvVar16,indexB1,&time,local_80);
                    plVar10 = local_88;
                    local_10c = IDAGetQuadB(pvVar16,indexB2,&time,local_88);
                    printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n",
                           (int)**(undefined8 **)(*plVar11 + 0x10),
                           (*(undefined8 **)(*plVar11 + 0x10))[1]);
                    printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 2)\n",
                           (int)**(undefined8 **)(*plVar10 + 0x10),
                           (*(undefined8 **)(*plVar10 + 0x10))[1]);
                    putchar(10);
                    puts("   H = d2G/dp2:");
                    puts("        (1)            (2)");
                    printf("  %12.4e  %12.4e\n",
                           (int)*(undefined8 *)(*(long *)(*plVar11 + 0x10) + 0x10),
                           *(undefined8 *)(*(long *)(*plVar10 + 0x10) + 0x10));
                    printf("  %12.4e  %12.4e\n",
                           (int)*(undefined8 *)(*(long *)(*plVar11 + 0x10) + 0x18),
                           *(undefined8 *)(*(long *)(*plVar10 + 0x10) + 0x18));
                    IDAFree();
                    SUNLinSolFree(local_a8);
                    SUNMatDestroy(local_c8);
                    SUNLinSolFree(local_90);
                    SUNMatDestroy(local_d0);
                    SUNLinSolFree(local_b8);
                    SUNMatDestroy(pvVar15);
                    putchar(10);
                    puts("---------------------------------------------------------");
                    printf("Finite Differences ( dp1=%6.1e and dp2 = %6.1e )\n",0xd2f1a9fc,
                           0x406f400000000000);
                    puts("---------------------------------------------------------\n");
                    ida_mem = (void *)IDACreate(ctx);
                    plVar11 = local_68;
                    plVar10 = local_e0;
                    *(double *)*local_f8 = *(double *)*local_f8 + 0.001;
                    puVar14 = *(undefined8 **)(*local_e0 + 0x10);
                    *puVar14 = 0x3ff0000000000000;
                    puVar14[1] = 0;
                    puVar14[2] = 0;
                    uVar1 = *(ulong *)*local_f8;
                    puVar6 = *(ulong **)(*local_68 + 0x10);
                    *puVar6 = uVar1 ^ 0x8000000000000000;
                    puVar6[1] = uVar1;
                    puVar6[2] = 0;
                    N_VConst(0,local_a0);
                    local_10c = IDAInit(0,ida_mem,res,plVar10,plVar11);
                    local_10c = IDASStolerances(0x812dea11,0x3d06849b86a12b9b,ida_mem);
                    pvVar15 = (void *)SUNDenseMatrix(3,3,ctx);
                    iVar8 = check_retval(pvVar15,"SUNDenseMatrix",0);
                    if (iVar8 == 0) {
                      local_a8 = (void *)SUNLinSol_Dense(plVar10,pvVar15,ctx);
                      iVar8 = check_retval(local_a8,"SUNLinSol_Dense",0);
                      if (iVar8 == 0) {
                        local_10c = IDASetLinearSolver(ida_mem,local_a8,pvVar15);
                        iVar18 = 1;
                        iVar8 = check_retval(&local_10c,"IDASetLinearSolver",1);
                        if (iVar8 == 0) {
                          local_10c = IDASetUserData(ida_mem,local_f8);
                          local_10c = IDASetMaxNumSteps(ida_mem,10000);
                          local_10c = IDAQuadInit(ida_mem,rhsQ,local_a0);
                          local_10c = IDAQuadSStolerances(0x812dea11,0x3d06849b86a12b9b,ida_mem);
                          local_10c = IDASetQuadErrCon(ida_mem,1);
                          plVar10 = local_e0;
                          local_10c = IDASolve(0,ida_mem,&time,local_e0,plVar11,1);
                          plVar12 = local_a0;
                          local_10c = IDAGetQuad(ida_mem,&time,local_a0);
                          local_c8 = (void *)**(double **)(*plVar12 + 0x10);
                          *(double *)*local_f8 = *(double *)*local_f8 + -0.002;
                          puVar14 = *(undefined8 **)(*plVar10 + 0x10);
                          *puVar14 = 0x3ff0000000000000;
                          puVar14[1] = 0;
                          puVar14[2] = 0;
                          uVar1 = *(ulong *)*local_f8;
                          puVar6 = *(ulong **)(*plVar11 + 0x10);
                          *puVar6 = uVar1 ^ 0x8000000000000000;
                          puVar6[1] = uVar1;
                          puVar6[2] = 0;
                          N_VConst(0,plVar12);
                          local_10c = IDAReInit(0,ida_mem,plVar10,plVar11);
                          local_10c = IDAQuadReInit(ida_mem,plVar12);
                          local_10c = IDASolve(0,ida_mem,&time,plVar10,plVar11,1);
                          local_10c = IDAGetQuad(ida_mem,&time,plVar12);
                          plVar10 = local_e0;
                          dVar2 = **(double **)(*plVar12 + 0x10);
                          local_b8 = (void *)(((double)local_c8 - local_b0) / 0.001);
                          local_90 = (void *)(((double)local_c8 - dVar2) / 0.002);
                          local_e8 = (void *)(local_b0 * -2.0);
                          local_c8 = (void *)(((double)local_c8 + (double)local_e8 + dVar2) / 1e-06)
                          ;
                          dVar20 = *(double *)(*local_f8 + 8) + 250.0;
                          local_48 = (local_b0 - dVar2) / 0.001;
                          auVar7._8_4_ = SUB84(dVar20,0);
                          auVar7._0_8_ = *(double *)*local_f8 + 0.001;
                          auVar7._12_4_ = (int)((ulong)dVar20 >> 0x20);
                          *local_f8 = auVar7;
                          puVar14 = *(undefined8 **)(*local_e0 + 0x10);
                          *puVar14 = 0x3ff0000000000000;
                          puVar14[1] = 0;
                          puVar14[2] = 0;
                          uVar1 = *(ulong *)*local_f8;
                          puVar6 = *(ulong **)(*plVar11 + 0x10);
                          *puVar6 = uVar1 ^ 0x8000000000000000;
                          puVar6[1] = uVar1;
                          puVar6[2] = 0;
                          N_VConst(0,plVar12);
                          local_10c = IDAReInit(0,ida_mem,plVar10,plVar11);
                          local_10c = IDAQuadReInit(ida_mem,plVar12);
                          local_10c = IDASolve(0,ida_mem,&time,plVar10,plVar11,1);
                          local_10c = IDAGetQuad(ida_mem,&time,plVar12);
                          local_d0 = (void *)**(double **)(*plVar12 + 0x10);
                          *(double *)(*local_f8 + 8) = *(double *)(*local_f8 + 8) + -500.0;
                          puVar14 = *(undefined8 **)(*plVar10 + 0x10);
                          *puVar14 = 0x3ff0000000000000;
                          puVar14[1] = 0;
                          puVar14[2] = 0;
                          uVar1 = *(ulong *)*local_f8;
                          puVar6 = *(ulong **)(*plVar11 + 0x10);
                          *puVar6 = uVar1 ^ 0x8000000000000000;
                          puVar6[1] = uVar1;
                          puVar6[2] = 0;
                          N_VConst(0,plVar12);
                          local_10c = IDAReInit(0,ida_mem,plVar10,plVar11);
                          local_10c = IDAQuadReInit(ida_mem,plVar12);
                          local_10c = IDASolve(0,ida_mem,&time,plVar10,plVar11,1);
                          local_10c = IDAGetQuad(ida_mem,&time,plVar12);
                          dVar2 = **(double **)(*plVar12 + 0x10);
                          local_50 = ((double)local_d0 - local_b0) / 250.0;
                          dVar20 = (double)local_e8 + (double)local_d0;
                          local_d0 = (void *)(((double)local_d0 - dVar2) / 500.0);
                          local_b0 = (local_b0 - dVar2) / 250.0;
                          local_e8 = (void *)((dVar20 + dVar2) / 62500.0);
                          putchar(10);
                          printf("   dG/dp:  %12.4e  %12.4e   (fwd FD)\n",(int)local_b8,local_50);
                          printf("           %12.4e  %12.4e   (bck FD)\n",SUB84(local_48,0),local_b0
                                );
                          printf("           %12.4e  %12.4e   (cntr FD)\n",(int)local_90,local_d0);
                          putchar(10);
                          printf("  H(1,1):  %12.4e\n",(int)local_c8);
                          printf("  H(2,2):  %12.4e\n",(int)local_e8);
                          IDAFree(&ida_mem);
                          SUNLinSolFree(local_a8);
                          SUNMatDestroy(pvVar15);
                          N_VDestroy(local_78);
                          N_VDestroy(local_58);
                          N_VDestroy(local_80);
                          N_VDestroy(local_60);
                          N_VDestroy(local_40);
                          N_VDestroy(local_88);
                          N_VDestroy(plVar10);
                          N_VDestroy(local_68);
                          N_VDestroy(plVar12);
                          N_VDestroyVectorArray(local_98,2);
                          N_VDestroyVectorArray(local_70,2);
                          N_VDestroyVectorArray(puVar13,2);
                          free(local_f8);
                          SUNContext_Free(&ctx);
                          iVar18 = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar18;
}

Assistant:

int main(int argc, char* argv[])
{
  N_Vector yy, yp, q, *yyS, *ypS, *qS;
  N_Vector yyB1, ypB1, qB1, yyB2, ypB2, qB2;
  void* ida_mem;
  UserData data;
  sunrealtype time, ti, tf;
  int retval, nckp, indexB1, indexB2, is;
  sunrealtype G, Gm, Gp, dp1, dp2, grdG_fwd[2], grdG_bck[2], grdG_cntr[2], H11,
    H22;
  sunrealtype rtolFD, atolFD;
  SUNMatrix A, AB1, AB2;
  SUNLinearSolver LS, LSB1, LSB2;

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext ctx = NULL;
  SUNContext_Create(SUN_COMM_NULL, &ctx);

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("---------------------------------------------------------\n");
  printf("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0\n");
  printf("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0\n");
  printf("               y1  +  y2  +  y3 = 0\n\n");
  printf("Find dG/dp and d^2G/dp^2, where p=[p1,p2] for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* Alocate and initialize user data. */
  data       = (UserData)malloc(sizeof(*data));
  data->p[0] = P1;
  data->p[1] = P2;
  data->p[2] = P3;

  /* Consistent IC */
  yy         = N_VNew_Serial(NEQ, ctx);
  yp         = N_VClone(yy);
  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -P1;
  Ith(yp, 2) = P1;
  Ith(yp, 3) = 0;

  q = N_VNew_Serial(1, ctx);
  N_VConst(ZERO, q);

  yyS = N_VCloneVectorArray(NP, yy);
  ypS = N_VCloneVectorArray(NP, yp);
  N_VConst(ZERO, yyS[0]);
  N_VConst(ZERO, yyS[1]);
  N_VConst(ZERO, ypS[0]);
  N_VConst(ZERO, ypS[1]);

  qS = N_VCloneVectorArray(NP, q);
  for (is = 0; is < NP; is++) { N_VConst(ZERO, qS[is]); }

  ida_mem = IDACreate(ctx);

  ti     = T0;
  retval = IDAInit(ida_mem, res, ti, yy, yp);

  /* Forward problem's setup. */
  retval = IDASStolerances(ida_mem, RTOL, ATOL);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  retval = IDASetMaxNumSteps(ida_mem, 1500);

  /* Quadrature's setup. */
  retval = IDAQuadInit(ida_mem, rhsQ, q);
  retval = IDAQuadSStolerances(ida_mem, RTOL, ATOL);
  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);

  /* Sensitivity's setup. */
  retval = IDASensInit(ida_mem, NP, IDA_SIMULTANEOUS, resS, yyS, ypS);
  retval = IDASensEEtolerances(ida_mem);
  retval = IDASetSensErrCon(ida_mem, SUNTRUE);

  /* Setup of quadrature's sensitivities */
  retval = IDAQuadSensInit(ida_mem, rhsQS, qS);
  retval = IDAQuadSensEEtolerances(ida_mem);
  retval = IDASetQuadSensErrCon(ida_mem, SUNTRUE);

  /* Initialize ASA. */
  retval = IDAAdjInit(ida_mem, 100, IDA_HERMITE);

  printf("---------------------------------------------------------\n");
  printf("Forward integration\n");
  printf("---------------------------------------------------------\n\n");

  tf     = TF;
  retval = IDASolveF(ida_mem, tf, &time, yy, yp, IDA_NORMAL, &nckp);

  IDAGetQuad(ida_mem, &time, q);
  G = Ith(q, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("     G:    %12.4Le\n", G);
#else
  printf("     G:    %12.4e\n", G);
#endif

  /* Sensitivities are needed for IC of backward problems. */
  IDAGetSensDky(ida_mem, tf, 0, yyS);
  IDAGetSensDky(ida_mem, tf, 1, ypS);

  IDAGetQuadSens(ida_mem, &time, qS);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(qS[0], 1), Ith(qS[1], 1));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(qS[0], 1), Ith(qS[1], 1));
#endif
  printf("\n");
  /******************************
  * BACKWARD PROBLEM #1
  *******************************/

  /* Consistent IC. */
  yyB1 = N_VNew_Serial(2 * NEQ, ctx);
  ypB1 = N_VClone(yyB1);

  N_VConst(ZERO, yyB1);
  Ith(yyB1, 3) = Ith(yy, 3);
  Ith(yyB1, 6) = Ith(yyS[0], 3);

  N_VConst(ZERO, ypB1);
  Ith(ypB1, 1) = Ith(yy, 3) - Ith(yy, 1);
  Ith(ypB1, 2) = Ith(yy, 3) - Ith(yy, 2);
  Ith(ypB1, 4) = Ith(yyS[0], 3) - Ith(yyS[0], 1);
  Ith(ypB1, 5) = Ith(yyS[0], 3) - Ith(yyS[0], 2);

  qB1 = N_VNew_Serial(2 * NP, ctx);
  N_VConst(ZERO, qB1);

  retval = IDACreateB(ida_mem, &indexB1);
  retval = IDAInitBS(ida_mem, indexB1, resBS1, tf, yyB1, ypB1);
  retval = IDASStolerancesB(ida_mem, indexB1, RTOLA, ATOLA);
  retval = IDASetUserDataB(ida_mem, indexB1, data);
  retval = IDASetMaxNumStepsB(ida_mem, indexB1, 5000);

  /* Create dense SUNMatrix for use in linear solves */
  AB1 = SUNDenseMatrix(2 * NEQ, 2 * NEQ, ctx);
  if (check_retval((void*)AB1, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB1 = SUNLinSol_Dense(yyB1, AB1, ctx);
  if (check_retval((void*)LSB1, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB1, LSB1, AB1);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  retval = IDAQuadInitBS(ida_mem, indexB1, rhsQBS1, qB1);

  /******************************
  * BACKWARD PROBLEM #2
  *******************************/

  /* Consistent IC. */
  yyB2 = N_VNew_Serial(2 * NEQ, ctx);
  ypB2 = N_VNew_Serial(2 * NEQ, ctx);

  N_VConst(ZERO, yyB2);
  Ith(yyB2, 3) = Ith(yy, 3);
  Ith(yyB2, 6) = Ith(yyS[1], 3);

  N_VConst(ZERO, ypB2);
  Ith(ypB2, 1) = Ith(yy, 3) - Ith(yy, 1);
  Ith(ypB2, 2) = Ith(yy, 3) - Ith(yy, 2);
  Ith(ypB2, 4) = Ith(yyS[1], 3) - Ith(yyS[1], 1);
  Ith(ypB2, 5) = Ith(yyS[1], 3) - Ith(yyS[1], 2);

  qB2 = N_VNew_Serial(2 * NP, ctx);
  N_VConst(ZERO, qB2);

  retval = IDACreateB(ida_mem, &indexB2);
  retval = IDAInitBS(ida_mem, indexB2, resBS2, tf, yyB2, ypB2);
  retval = IDASStolerancesB(ida_mem, indexB2, RTOLA, ATOLA);
  retval = IDASetUserDataB(ida_mem, indexB2, data);
  retval = IDASetMaxNumStepsB(ida_mem, indexB2, 2500);

  /* Create dense SUNMatrix for use in linear solves */
  AB2 = SUNDenseMatrix(2 * NEQ, 2 * NEQ, ctx);
  if (check_retval((void*)AB2, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB2 = SUNLinSol_Dense(yyB2, AB2, ctx);
  if (check_retval((void*)LSB2, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB2, LSB2, AB2);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  retval = IDAQuadInitBS(ida_mem, indexB2, rhsQBS2, qB2);

  /* Integrate backward problems. */
  printf("---------------------------------------------------------\n");
  printf("Backward integration \n");
  printf("---------------------------------------------------------\n\n");

  retval = IDASolveB(ida_mem, ti, IDA_NORMAL);

  retval = IDAGetB(ida_mem, indexB1, &time, yyB1, ypB1);
  /*
     retval = IDAGetNumSteps(IDAGetAdjIDABmem(ida_mem, indexB1), &nst);
     printf("at time=%g \tpb 1 Num steps:%d\n", time, nst);
     retval = IDAGetNumSteps(IDAGetAdjIDABmem(ida_mem, indexB2), &nst);
     printf("at time=%g \tpb 2 Num steps:%d\n\n", time, nst);
  */

  retval = IDAGetQuadB(ida_mem, indexB1, &time, qB1);
  retval = IDAGetQuadB(ida_mem, indexB2, &time, qB2);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 1)\n", Ith(qB1, 1),
         Ith(qB1, 2));
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 2)\n", Ith(qB2, 1),
         Ith(qB2, 2));
#else
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n", Ith(qB1, 1),
         Ith(qB1, 2));
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 2)\n", Ith(qB2, 1),
         Ith(qB2, 2));
#endif

  printf("\n");
  printf("   H = d2G/dp2:\n");
  printf("        (1)            (2)\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  %12.4Le  %12.4Le\n", Ith(qB1, 3), Ith(qB2, 3));
  printf("  %12.4Le  %12.4Le\n", Ith(qB1, 4), Ith(qB2, 4));
#else
  printf("  %12.4e  %12.4e\n", Ith(qB1, 3), Ith(qB2, 3));
  printf("  %12.4e  %12.4e\n", Ith(qB1, 4), Ith(qB2, 4));
#endif

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB1);
  SUNMatDestroy(AB1);
  SUNLinSolFree(LSB2);
  SUNMatDestroy(AB2);

  /*********************************
  * Use Finite Differences to verify
  **********************************/

  /* Perturbations are of different magnitudes as p1 and p2 are. */
  dp1 = SUN_RCONST(1.0e-3);
  dp2 = SUN_RCONST(2.5e+2);

  printf("\n");
  printf("---------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Finite Differences ( dp1=%6.1Le and dp2 = %6.1Le )\n", dp1, dp2);
#else
  printf("Finite Differences ( dp1=%6.1e and dp2 = %6.1e )\n", dp1, dp2);
#endif
  printf("---------------------------------------------------------\n\n");

  ida_mem = IDACreate(ctx);

  /********************
  * Forward FD for p1
  ********************/
  data->p[0] += dp1;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);
  ti = T0;
  tf = TF;

  retval = IDAInit(ida_mem, res, ti, yy, yp);

  rtolFD = SUN_RCONST(1.0e-12);
  atolFD = SUN_RCONST(1.0e-14);

  retval = IDASStolerances(ida_mem, rtolFD, atolFD);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  retval = IDASetMaxNumSteps(ida_mem, 10000);

  retval = IDAQuadInit(ida_mem, rhsQ, q);
  retval = IDAQuadSStolerances(ida_mem, rtolFD, atolFD);
  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gp     = Ith(q, 1);

  /********************
  * Backward FD for p1
  ********************/
  data->p[0] -= 2 * dp1;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gm     = Ith(q, 1);

  /* Compute FD for p1. */
  grdG_fwd[0]  = (Gp - G) / dp1;
  grdG_bck[0]  = (G - Gm) / dp1;
  grdG_cntr[0] = (Gp - Gm) / (2.0 * dp1);
  H11          = (Gp - 2.0 * G + Gm) / (dp1 * dp1);

  /********************
  * Forward FD for p2
  ********************/
  /*restore p1*/
  data->p[0] += dp1;
  data->p[1] += dp2;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gp     = Ith(q, 1);

  /********************
  * Backward FD for p2
  ********************/
  data->p[1] -= 2 * dp2;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gm     = Ith(q, 1);

  /* Compute FD for p2. */
  grdG_fwd[1]  = (Gp - G) / dp2;
  grdG_bck[1]  = (G - Gm) / dp2;
  grdG_cntr[1] = (Gp - Gm) / (2.0 * dp2);
  H22          = (Gp - 2.0 * G + Gm) / (dp2 * dp2);

  printf("\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le  %12.4Le   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4Le  %12.4Le   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4Le  %12.4Le   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4Le\n", H11);
  printf("  H(2,2):  %12.4Le\n", H22);
#else
  printf("   dG/dp:  %12.4e  %12.4e   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4e  %12.4e   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4e  %12.4e   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4e\n", H11);
  printf("  H(2,2):  %12.4e\n", H22);
#endif

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(yyB1);
  N_VDestroy(ypB1);
  N_VDestroy(qB1);

  N_VDestroy(yyB2);
  N_VDestroy(ypB2);
  N_VDestroy(qB2);

  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  N_VDestroyVectorArray(yyS, NP);
  N_VDestroyVectorArray(ypS, NP);
  N_VDestroyVectorArray(qS, NP);

  free(data);

  SUNContext_Free(&ctx);
  return 0;
}